

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CConnman::ThreadDNSAddressSeed(CConnman *this)

{
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  bool bVar1;
  strong_ordering sVar2;
  int iVar3;
  iterator iVar4;
  size_t sVar5;
  size_type sVar6;
  FastRandomContext *this_00;
  rep rVar7;
  long in_RDI;
  long in_FS_OFFSET;
  CNetAddr *ip;
  vector<CNetAddr,_std::allocator<CNetAddr>_> *__range5;
  uint nMaxIPs;
  string *seed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  int seeds_right_now;
  int outbound_connection_count;
  const_iterator __end5;
  const_iterator __begin5;
  vector<CNetAddr,_std::allocator<CNetAddr>_> addresses;
  ServiceFlags requiredServiceBits;
  vector<CAddress,_std::allocator<CAddress>_> vAdd;
  seconds w;
  seconds to_wait;
  iterator __end2;
  iterator __begin2;
  seconds seeds_wait_time;
  int found;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seeds;
  seconds SEEDNODE_TIMEOUT;
  time_point start;
  CAddress addr;
  CNetAddr resolveSource;
  string host;
  FastRandomContext rng;
  undefined4 in_stack_fffffffffffff998;
  undefined2 in_stack_fffffffffffff99c;
  uint16_t in_stack_fffffffffffff99e;
  char *in_stack_fffffffffffff9a0;
  char *pcVar8;
  FastRandomContext *in_stack_fffffffffffff9a8;
  string *in_stack_fffffffffffff9b0;
  _Optional_payload_base<Network> in_stack_fffffffffffff9b8;
  seconds in_stack_fffffffffffff9c0;
  duration<long,_std::ratio<3600L,_1L>_> in_stack_fffffffffffff9c8;
  hours in_stack_fffffffffffff9d0;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> in_stack_fffffffffffff9d8
  ;
  char *in_stack_fffffffffffff9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9e8;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> in_stack_fffffffffffff9f0
  ;
  reference in_stack_fffffffffffff9f8;
  undefined6 in_stack_fffffffffffffa00;
  uint16_t in_stack_fffffffffffffa06;
  int in_stack_fffffffffffffa0c;
  ConstevalFormatString<1U> in_stack_fffffffffffffa48;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffa50;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffa58;
  char *pcVar9;
  size_t in_stack_fffffffffffffa60;
  char *in_stack_fffffffffffffa68;
  int local_4ec;
  int local_4c4;
  Level LVar10;
  undefined8 in_stack_fffffffffffffb40;
  char *in_stack_fffffffffffffb50;
  int local_47c;
  undefined1 local_2a8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  optional<bool> local_262;
  rep local_260;
  undefined1 local_258 [7];
  allocator<char> local_251 [97];
  duration local_1f0;
  duration local_1e8;
  byte local_1dc [20];
  undefined1 local_1c8 [63];
  allocator<char> local_189;
  optional<Network> local_188;
  optional<Network> local_180;
  optional<Network> local_178 [11];
  duration local_120;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_47c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
             (allocator<char> *)in_stack_fffffffffffff9d8.__d.__r);
  bVar1 = ArgsManager::IsArgSet
                    ((ArgsManager *)in_stack_fffffffffffff9c0.__r,
                     (string *)in_stack_fffffffffffff9b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT26(in_stack_fffffffffffff99e,
                      CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
  std::allocator<char>::~allocator(&local_189);
  if (bVar1) {
    local_1c8._48_8_ = NodeClock::now();
    local_1c8._40_4_ = 0x1e;
    local_1c8._44_4_ = 0;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9b8,
               (char *)in_stack_fffffffffffff9b0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9b8,
               (char *)in_stack_fffffffffffff9b0);
    local_1c8._0_8_ =
         std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                   ((duration<long,_std::ratio<1L,_1L>_> *)
                    CONCAT26(in_stack_fffffffffffff99e,
                             CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
    in_stack_fffffffffffff9a8 = (FastRandomContext *)local_1c8;
    in_stack_fffffffffffff998 = 2;
    in_stack_fffffffffffff9a0 =
         "-seednode enabled. Trying the provided seeds for %d seconds before defaulting to the dnsseeds.\n"
    ;
    logging_function._M_str = in_stack_fffffffffffffa68;
    logging_function._M_len = in_stack_fffffffffffffa60;
    source_file._M_str = (char *)in_stack_fffffffffffffa58._M_current;
    source_file._M_len = (size_t)in_stack_fffffffffffffa50._M_current;
    LogPrintFormatInternal<long>
              (logging_function,source_file,in_stack_fffffffffffffa0c,
               CONCAT26(in_stack_fffffffffffffa06,in_stack_fffffffffffffa00),
               (Level)in_stack_fffffffffffffb40,in_stack_fffffffffffffa48,
               (long *)in_stack_fffffffffffffb50);
    do {
      bVar1 = CThreadInterrupt::operator_cast_to_bool
                        ((CThreadInterrupt *)
                         CONCAT26(in_stack_fffffffffffff99e,
                                  CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00212634;
      local_1dc[0] = 0xf4;
      local_1dc[1] = 1;
      local_1dc[2] = 0;
      local_1dc[3] = 0;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,_std::ratio<1L,_1000L>_> *)
                 CONCAT26(in_stack_fffffffffffff99e,
                          CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)),
                 (int *)0x212419);
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::
      duration<long,std::ratio<1l,1000l>,void>
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff9a0,
                 (duration<long,_std::ratio<1L,_1000L>_> *)
                 CONCAT26(in_stack_fffffffffffff99e,
                          CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
      bVar1 = CThreadInterrupt::sleep_for
                        ((CThreadInterrupt *)in_stack_fffffffffffff9d0.__r,
                         (duration)in_stack_fffffffffffff9d8.__d.__r);
      if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00213656;
      local_1e8.__r = (rep)NodeClock::now();
      local_1f0.__r =
           (rep)std::chrono::operator+
                          ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)in_stack_fffffffffffff9a0,
                           (duration<long,_std::ratio<1L,_1L>_> *)
                           CONCAT26(in_stack_fffffffffffff99e,
                                    CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
      sVar2 = std::chrono::
              operator<=><NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)in_stack_fffffffffffff9a0,
                         (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)CONCAT26(in_stack_fffffffffffff99e,
                                     CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)))
      ;
      std::__cmp_cat::__unspec::__unspec
                ((__unspec *)
                 CONCAT26(in_stack_fffffffffffff99e,
                          CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)),
                 (__unspec *)0x2124f8);
      bVar1 = std::operator>(sVar2._M_value);
      LVar10 = (Level)in_stack_fffffffffffffb40;
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9b8,
                   (char *)in_stack_fffffffffffff9b0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9b8,
                   (char *)in_stack_fffffffffffff9b0);
        in_stack_fffffffffffff998 = 2;
        in_stack_fffffffffffff9a0 =
             "Couldn\'t connect to enough peers via seed nodes. Handing fetch logic to the DNS seeds.\n"
        ;
        logging_function_00._M_str = in_stack_fffffffffffffa68;
        logging_function_00._M_len = in_stack_fffffffffffffa60;
        source_file_00._M_str = (char *)in_stack_fffffffffffffa58._M_current;
        source_file_00._M_len = (size_t)in_stack_fffffffffffffa50._M_current;
        LogPrintFormatInternal<>
                  (logging_function_00,source_file_00,in_stack_fffffffffffffa0c,
                   CONCAT26(in_stack_fffffffffffffa06,in_stack_fffffffffffffa00),LVar10,
                   (ConstevalFormatString<0U>)in_stack_fffffffffffffa48.fmt);
        goto LAB_00212634;
      }
      local_47c = GetFullOutboundConnCount((CConnman *)in_stack_fffffffffffff9d8.__d.__r);
      LVar10 = (Level)in_stack_fffffffffffffb40;
    } while (local_47c < 2);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9b8,
               (char *)in_stack_fffffffffffff9b0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9b8,
               (char *)in_stack_fffffffffffff9b0);
    in_stack_fffffffffffffb50 = "P2P peers available. Finished fetching data from seed nodes.\n";
    in_stack_fffffffffffff998 = 2;
    in_stack_fffffffffffff9a0 = "P2P peers available. Finished fetching data from seed nodes.\n";
    logging_function_01._M_str = in_stack_fffffffffffffa68;
    logging_function_01._M_len = in_stack_fffffffffffffa60;
    source_file_01._M_str = (char *)in_stack_fffffffffffffa58._M_current;
    source_file_01._M_len = (size_t)in_stack_fffffffffffffa50._M_current;
    LogPrintFormatInternal<>
              (logging_function_01,source_file_01,in_stack_fffffffffffffa0c,
               CONCAT26(in_stack_fffffffffffffa06,in_stack_fffffffffffffa00),LVar10,
               (ConstevalFormatString<0U>)in_stack_fffffffffffffa48.fmt);
  }
LAB_00212634:
  FastRandomContext::FastRandomContext
            (in_stack_fffffffffffff9a8,SUB81((ulong)in_stack_fffffffffffff9a0 >> 0x38,0));
  CChainParams::DNSSeeds_abi_cxx11_
            ((CChainParams *)
             CONCAT26(in_stack_fffffffffffff99e,
                      CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff9f0.__d.__r,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff9e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffff9a0);
  iVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff9a0);
  std::
  shuffle<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,FastRandomContext&>
            (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
             (FastRandomContext *)CONCAT26(in_stack_fffffffffffffa06,in_stack_fffffffffffffa00));
  local_4c4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
             (allocator<char> *)in_stack_fffffffffffff9d8.__d.__r);
  bVar1 = ArgsManager::GetBoolArg
                    ((ArgsManager *)in_stack_fffffffffffff9a0,
                     (string *)
                     CONCAT26(in_stack_fffffffffffff99e,
                              CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)),
                     SUB81((ulong)in_stack_fffffffffffff9a8 >> 0x38,0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT26(in_stack_fffffffffffff99e,
                      CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
  std::allocator<char>::~allocator(local_251);
  if (bVar1) {
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT26(in_stack_fffffffffffff99e,
                               CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
    local_4c4 = (int)sVar6;
  }
  else {
    in_stack_fffffffffffffa68 = *(char **)(in_RDI + 0xb0);
    std::optional<Network>::optional(local_178);
    std::optional<bool>::optional((optional<bool> *)(local_258 + 5));
    sVar5 = AddrMan::Size((AddrMan *)in_stack_fffffffffffff9a0,
                          (optional<Network>)in_stack_fffffffffffff9b8,
                          (_Optional_base<bool,_true,_true>)
                          SUB82((ulong)in_stack_fffffffffffff9a8 >> 0x30,0));
    if (sVar5 == 0) {
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT26(in_stack_fffffffffffff99e,
                                 CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
      local_4c4 = (int)sVar6;
    }
  }
  LVar10 = (Level)iVar4._M_current;
  if ((local_47c < 2) || (local_4c4 != 0)) {
    local_258._0_4_ = 0;
    pcVar9 = *(char **)(in_RDI + 0xb0);
    std::optional<Network>::optional(&local_180);
    std::optional<bool>::optional(&local_262);
    sVar5 = AddrMan::Size((AddrMan *)in_stack_fffffffffffff9a0,
                          (optional<Network>)in_stack_fffffffffffff9b8,
                          (_Optional_base<bool,_true,_true>)
                          SUB82((ulong)in_stack_fffffffffffff9a8 >> 0x30,0));
    if (sVar5 < 1000) {
      local_260 = 0xb;
    }
    else {
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,std::ratio<60l,1l>,void>
                ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff9a0,
                 (duration<long,_std::ratio<60L,_1L>_> *)
                 CONCAT26(in_stack_fffffffffffff99e,
                          CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
    }
    local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff9a0);
    local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff9a0);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff9a8,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff9a0);
      LVar10 = (Level)iVar4._M_current;
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      this_00 = (FastRandomContext *)
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT26(in_stack_fffffffffffff99e,
                                        CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998
                                                )));
      if (local_4c4 == 0) {
        local_4c4 = 3;
        in_stack_fffffffffffffa48.fmt = *(char **)(in_RDI + 0xb0);
        std::optional<Network>::optional(&local_188);
        std::optional<bool>::optional((optional<bool> *)(local_2a8 + 0x2e));
        in_stack_fffffffffffffa50._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             AddrMan::Size((AddrMan *)in_stack_fffffffffffff9a0,
                           (optional<Network>)in_stack_fffffffffffff9b8,
                           (_Optional_base<bool,_true,_true>)
                           SUB82((ulong)in_stack_fffffffffffff9a8 >> 0x30,0));
        if (in_stack_fffffffffffffa50._M_current !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9b8,
                     (char *)in_stack_fffffffffffff9b0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9b8,
                     (char *)in_stack_fffffffffffff9b0);
          local_2a8._0_8_ =
               std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                         ((duration<long,_std::ratio<1L,_1L>_> *)
                          CONCAT26(in_stack_fffffffffffff99e,
                                   CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
          in_stack_fffffffffffff9a8 = (FastRandomContext *)local_2a8;
          pcVar8 = "Waiting %d seconds before querying DNS seeds.\n";
          in_stack_fffffffffffff998 = 2;
          logging_function_02._M_str = in_stack_fffffffffffffa68;
          logging_function_02._M_len = sVar5;
          source_file_02._M_str = pcVar9;
          source_file_02._M_len = (size_t)in_stack_fffffffffffffa50._M_current;
          LogPrintFormatInternal<long>
                    (logging_function_02,source_file_02,in_stack_fffffffffffffa0c,
                     CONCAT26(in_stack_fffffffffffffa06,in_stack_fffffffffffffa00),
                     (Level)iVar4._M_current,in_stack_fffffffffffffa48,
                     (long *)in_stack_fffffffffffffb50);
          while (rVar7 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                                   ((duration<long,_std::ratio<1L,_1L>_> *)
                                    CONCAT26(in_stack_fffffffffffff99e,
                                             CONCAT24(in_stack_fffffffffffff99c,
                                                      in_stack_fffffffffffff998))), 0 < rVar7) {
            std::min<std::chrono::duration<long,std::ratio<1l,1l>>>
                      ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff9a8,
                       (duration<long,_std::ratio<1L,_1L>_> *)pcVar8);
            std::chrono::duration<long,std::ratio<1l,1000000000l>>::
            duration<long,std::ratio<1l,1l>,void>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)pcVar8,
                       (duration<long,_std::ratio<1L,_1L>_> *)
                       CONCAT26(in_stack_fffffffffffff99e,
                                CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
            bVar1 = CThreadInterrupt::sleep_for
                              ((CThreadInterrupt *)in_stack_fffffffffffff9d0.__r,
                               (duration)in_stack_fffffffffffff9d8.__d.__r);
            if (!bVar1) goto LAB_0021363c;
            std::chrono::duration<long,_std::ratio<1L,_1L>_>::operator-=
                      ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff9a8,
                       (duration<long,_std::ratio<1L,_1L>_> *)pcVar8);
            iVar3 = GetFullOutboundConnCount((CConnman *)in_stack_fffffffffffff9d8.__d.__r);
            LVar10 = (Level)iVar4._M_current;
            if (1 < iVar3) {
              if ((int)local_258._0_4_ < 1) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
                in_stack_fffffffffffff998 = 2;
                logging_function_05._M_str = in_stack_fffffffffffffa68;
                logging_function_05._M_len = sVar5;
                source_file_05._M_str = pcVar9;
                source_file_05._M_len = (size_t)in_stack_fffffffffffffa50._M_current;
                LogPrintFormatInternal<>
                          (logging_function_05,source_file_05,in_stack_fffffffffffffa0c,
                           CONCAT26(in_stack_fffffffffffffa06,in_stack_fffffffffffffa00),LVar10,
                           (ConstevalFormatString<0U>)in_stack_fffffffffffffa48.fmt);
              }
              else {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
                in_stack_fffffffffffff9a8 = (FastRandomContext *)local_258;
                logging_function_03._M_str = in_stack_fffffffffffffa68;
                logging_function_03._M_len = sVar5;
                source_file_03._M_str = pcVar9;
                source_file_03._M_len = (size_t)in_stack_fffffffffffffa50._M_current;
                LogPrintFormatInternal<int>
                          (logging_function_03,source_file_03,in_stack_fffffffffffffa0c,
                           CONCAT26(in_stack_fffffffffffffa06,in_stack_fffffffffffffa00),LVar10,
                           in_stack_fffffffffffffa48,(int *)in_stack_fffffffffffffb50);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
                in_stack_fffffffffffff998 = 2;
                logging_function_04._M_str = in_stack_fffffffffffffa68;
                logging_function_04._M_len = sVar5;
                source_file_04._M_str = pcVar9;
                source_file_04._M_len = (size_t)in_stack_fffffffffffffa50._M_current;
                LogPrintFormatInternal<>
                          (logging_function_04,source_file_04,in_stack_fffffffffffffa0c,
                           CONCAT26(in_stack_fffffffffffffa06,in_stack_fffffffffffffa00),LVar10,
                           (ConstevalFormatString<0U>)in_stack_fffffffffffffa48.fmt);
              }
              goto LAB_0021363c;
            }
          }
        }
      }
      bVar1 = CThreadInterrupt::operator_cast_to_bool
                        ((CThreadInterrupt *)
                         CONCAT26(in_stack_fffffffffffff99e,
                                  CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
      if (bVar1) goto LAB_0021363c;
      bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff9b0);
      if (!bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9b8,
                   (char *)in_stack_fffffffffffff9b0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9b8,
                   (char *)in_stack_fffffffffffff9b0);
        pcVar8 = "Waiting for network to be reactivated before querying DNS seeds.\n";
        in_stack_fffffffffffff998 = 2;
        logging_function_06._M_str = in_stack_fffffffffffffa68;
        logging_function_06._M_len = sVar5;
        source_file_06._M_str = pcVar9;
        source_file_06._M_len = (size_t)in_stack_fffffffffffffa50._M_current;
        LogPrintFormatInternal<>
                  (logging_function_06,source_file_06,in_stack_fffffffffffffa0c,
                   CONCAT26(in_stack_fffffffffffffa06,in_stack_fffffffffffffa00),
                   (Level)iVar4._M_current,(ConstevalFormatString<0U>)in_stack_fffffffffffffa48.fmt)
        ;
        do {
          std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                    ((duration<long,_std::ratio<1L,_1L>_> *)
                     CONCAT26(in_stack_fffffffffffff99e,
                              CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)),
                     (int *)0x212ea1);
          std::chrono::duration<long,std::ratio<1l,1000000000l>>::
          duration<long,std::ratio<1l,1l>,void>
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)pcVar8,
                     (duration<long,_std::ratio<1L,_1L>_> *)
                     CONCAT26(in_stack_fffffffffffff99e,
                              CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
          bVar1 = CThreadInterrupt::sleep_for
                            ((CThreadInterrupt *)in_stack_fffffffffffff9d0.__r,
                             (duration)in_stack_fffffffffffff9d8.__d.__r);
          in_stack_fffffffffffffa0c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa0c);
          if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0021363c;
          bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff9b0);
        } while (((bVar1 ^ 0xffU) & 1) != 0);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9b8,
                 (char *)in_stack_fffffffffffff9b0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9b8,
                 (char *)in_stack_fffffffffffff9b0);
      in_stack_fffffffffffff9a0 = "Loading addresses from DNS seed %s\n";
      in_stack_fffffffffffff998 = 2;
      logging_function_07._M_str = in_stack_fffffffffffffa68;
      logging_function_07._M_len = sVar5;
      source_file_07._M_str = pcVar9;
      source_file_07._M_len = (size_t)in_stack_fffffffffffffa50._M_current;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_07,source_file_07,in_stack_fffffffffffffa0c,
                 CONCAT26(in_stack_fffffffffffffa06,in_stack_fffffffffffffa00),
                 (Level)iVar4._M_current,in_stack_fffffffffffffa48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb50);
      bVar1 = HaveNameProxy();
      in_stack_fffffffffffffa0c =
           CONCAT13((char)((uint)in_stack_fffffffffffffa0c >> 0x18),
                    CONCAT12(bVar1,(short)in_stack_fffffffffffffa0c));
      if (bVar1) {
        AddAddrFetch((CConnman *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
LAB_002134fb:
        local_4c4 = local_4c4 + -1;
      }
      else {
        std::vector<CAddress,_std::allocator<CAddress>_>::vector
                  ((vector<CAddress,_std::allocator<CAddress>_> *)
                   CONCAT26(in_stack_fffffffffffff99e,
                            CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
        tinyformat::format<ServiceFlags,std::__cxx11::string>
                  ((char *)in_stack_fffffffffffff9d8.__d.__r,
                   (ServiceFlags *)in_stack_fffffffffffff9d0.__r,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff9c8.__r);
        CNetAddr::CNetAddr((CNetAddr *)in_stack_fffffffffffff9a0);
        bVar1 = CNetAddr::SetInternal
                          ((CNetAddr *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
        in_stack_fffffffffffffa0c =
             CONCAT22((short)((uint)in_stack_fffffffffffffa0c >> 0x10),
                      CONCAT11(bVar1,(char)in_stack_fffffffffffffa0c));
        if (bVar1) {
          std::
          function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
          ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                      *)in_stack_fffffffffffff9b8,
                     (function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                      *)in_stack_fffffffffffff9b0);
          LookupHost((string *)CONCAT26(in_stack_fffffffffffffa06,in_stack_fffffffffffffa00),
                     (uint)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffff9f8 >> 0x18,0),
                     (DNSLookupFn *)in_stack_fffffffffffff9f0.__d.__r);
          std::
          function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
          ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                       *)CONCAT26(in_stack_fffffffffffff99e,
                                  CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
          bVar1 = std::vector<CNetAddr,_std::allocator<CNetAddr>_>::empty
                            ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)this_00);
          if (bVar1) {
            AddAddrFetch((CConnman *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
          }
          else {
            std::vector<CNetAddr,_std::allocator<CNetAddr>_>::begin
                      ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_stack_fffffffffffff9a0);
            std::vector<CNetAddr,_std::allocator<CNetAddr>_>::end
                      ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_stack_fffffffffffff9a0);
            while (bVar1 = __gnu_cxx::
                           operator==<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                                     ((__normal_iterator<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                                       *)this_00,
                                      (__normal_iterator<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                                       *)in_stack_fffffffffffff9a0), ((bVar1 ^ 0xffU) & 1) != 0) {
              in_stack_fffffffffffff9f8 =
                   __gnu_cxx::
                   __normal_iterator<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                   ::operator*((__normal_iterator<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                                *)CONCAT26(in_stack_fffffffffffff99e,
                                           CONCAT24(in_stack_fffffffffffff99c,
                                                    in_stack_fffffffffffff998)));
              in_stack_fffffffffffffa06 =
                   CChainParams::GetDefaultPort
                             ((CChainParams *)
                              CONCAT26(in_stack_fffffffffffff99e,
                                       CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)
                                      ));
              CService::CService((CService *)this_00,(CNetAddr *)in_stack_fffffffffffff9a0,
                                 in_stack_fffffffffffff99e);
              CAddress::CAddress((CAddress *)in_stack_fffffffffffff9c8.__r,
                                 (CService *)in_stack_fffffffffffff9c0.__r,
                                 (ServiceFlags)in_stack_fffffffffffff9b8);
              CService::~CService((CService *)
                                  CONCAT26(in_stack_fffffffffffff99e,
                                           CONCAT24(in_stack_fffffffffffff99c,
                                                    in_stack_fffffffffffff998)));
              in_stack_fffffffffffff9f0 =
                   Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                             ();
              h<(char)50,(char)52>();
              std::chrono::operator*
                        ((int *)in_stack_fffffffffffff9a0,
                         (duration<long,_std::ratio<3600L,_1L>_> *)
                         CONCAT26(in_stack_fffffffffffff99e,
                                  CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
              in_stack_fffffffffffff9d8 =
                   std::chrono::operator-
                             ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                               *)in_stack_fffffffffffff9a0,
                              (duration<long,_std::ratio<3600L,_1L>_> *)
                              CONCAT26(in_stack_fffffffffffff99e,
                                       CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)
                                      ));
              in_stack_fffffffffffff9d0 = h<(char)50,(char)52>();
              in_stack_fffffffffffff9c8 =
                   std::chrono::operator*
                             ((int *)in_stack_fffffffffffff9a0,
                              (duration<long,_std::ratio<3600L,_1L>_> *)
                              CONCAT26(in_stack_fffffffffffff99e,
                                       CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)
                                      ));
              std::chrono::duration<long,std::ratio<1l,1l>>::
              duration<long,std::ratio<3600l,1l>,void>
                        ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff9a0,
                         (duration<long,_std::ratio<3600L,_1L>_> *)
                         CONCAT26(in_stack_fffffffffffff99e,
                                  CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
              local_120.__r =
                   (rep)RandomMixin<FastRandomContext>::
                        rand_uniform_delay<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                                  ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff9b8,
                                   (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                                    *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9d8.__d);
              std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                        ((vector<CAddress,_std::allocator<CAddress>_> *)this_00,
                         (value_type *)in_stack_fffffffffffff9a0);
              local_258._0_4_ = local_258._0_4_ + 1;
              CAddress::~CAddress((CAddress *)
                                  CONCAT26(in_stack_fffffffffffff99e,
                                           CONCAT24(in_stack_fffffffffffff99c,
                                                    in_stack_fffffffffffff998)));
              __gnu_cxx::
              __normal_iterator<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
              ::operator++((__normal_iterator<const_CNetAddr_*,_std::vector<CNetAddr,_std::allocator<CNetAddr>_>_>
                            *)CONCAT26(in_stack_fffffffffffff99e,
                                       CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)
                                      ));
            }
            in_stack_fffffffffffff9b8 = *(_Optional_payload_base<Network> *)(in_RDI + 0xb0);
            in_stack_fffffffffffff9c0 = s<(char)48>();
            AddrMan::Add((AddrMan *)this_00,
                         (vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffff9a0,
                         (CNetAddr *)
                         CONCAT26(in_stack_fffffffffffff99e,
                                  CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)),
                         (seconds)in_stack_fffffffffffff9b8);
          }
          std::vector<CNetAddr,_std::allocator<CNetAddr>_>::~vector
                    ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)this_00);
          local_4ec = 0;
        }
        else {
          local_4ec = 5;
        }
        CNetAddr::~CNetAddr((CNetAddr *)
                            CONCAT26(in_stack_fffffffffffff99e,
                                     CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)))
        ;
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT26(in_stack_fffffffffffff99e,
                            CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
        std::vector<CAddress,_std::allocator<CAddress>_>::~vector
                  ((vector<CAddress,_std::allocator<CAddress>_> *)this_00);
        if (local_4ec == 0) goto LAB_002134fb;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT26(in_stack_fffffffffffff99e,
                               CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
      in_stack_fffffffffffff9a8 = this_00;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9b8,
               (char *)in_stack_fffffffffffff9b0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9b8,
               (char *)in_stack_fffffffffffff9b0);
    in_stack_fffffffffffff9a8 = (FastRandomContext *)local_258;
    in_stack_fffffffffffff998 = 2;
    logging_function_08._M_str = in_stack_fffffffffffffa68;
    logging_function_08._M_len = sVar5;
    source_file_08._M_str = pcVar9;
    source_file_08._M_len = (size_t)in_stack_fffffffffffffa50._M_current;
    LogPrintFormatInternal<int>
              (logging_function_08,source_file_08,in_stack_fffffffffffffa0c,
               CONCAT26(in_stack_fffffffffffffa06,in_stack_fffffffffffffa00),LVar10,
               in_stack_fffffffffffffa48,(int *)in_stack_fffffffffffffb50);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9b8,
               (char *)in_stack_fffffffffffff9b0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9b8,
               (char *)in_stack_fffffffffffff9b0);
    in_stack_fffffffffffff998 = 2;
    logging_function_09._M_str = in_stack_fffffffffffffa68;
    logging_function_09._M_len = in_stack_fffffffffffffa60;
    source_file_09._M_str = (char *)in_stack_fffffffffffffa58._M_current;
    source_file_09._M_len = (size_t)in_stack_fffffffffffffa50._M_current;
    LogPrintFormatInternal<>
              (logging_function_09,source_file_09,in_stack_fffffffffffffa0c,
               CONCAT26(in_stack_fffffffffffffa06,in_stack_fffffffffffffa00),LVar10,
               (ConstevalFormatString<0U>)in_stack_fffffffffffffa48.fmt);
  }
LAB_0021363c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff9a8);
  FastRandomContext::~FastRandomContext
            ((FastRandomContext *)
             CONCAT26(in_stack_fffffffffffff99e,
                      CONCAT24(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)));
LAB_00213656:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::ThreadDNSAddressSeed()
{
    int outbound_connection_count = 0;

    if (gArgs.IsArgSet("-seednode")) {
        auto start = NodeClock::now();
        constexpr std::chrono::seconds SEEDNODE_TIMEOUT = 30s;
        LogPrintf("-seednode enabled. Trying the provided seeds for %d seconds before defaulting to the dnsseeds.\n", SEEDNODE_TIMEOUT.count());
        while (!interruptNet) {
            if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
                return;

            // Abort if we have spent enough time without reaching our target.
            // Giving seed nodes 30 seconds so this does not become a race against fixedseeds (which triggers after 1 min)
            if (NodeClock::now() > start + SEEDNODE_TIMEOUT) {
                LogPrintf("Couldn't connect to enough peers via seed nodes. Handing fetch logic to the DNS seeds.\n");
                break;
            }

            outbound_connection_count = GetFullOutboundConnCount();
            if (outbound_connection_count >= SEED_OUTBOUND_CONNECTION_THRESHOLD) {
                LogPrintf("P2P peers available. Finished fetching data from seed nodes.\n");
                break;
            }
        }
    }

    FastRandomContext rng;
    std::vector<std::string> seeds = m_params.DNSSeeds();
    std::shuffle(seeds.begin(), seeds.end(), rng);
    int seeds_right_now = 0; // Number of seeds left before testing if we have enough connections

    if (gArgs.GetBoolArg("-forcednsseed", DEFAULT_FORCEDNSSEED)) {
        // When -forcednsseed is provided, query all.
        seeds_right_now = seeds.size();
    } else if (addrman.Size() == 0) {
        // If we have no known peers, query all.
        // This will occur on the first run, or if peers.dat has been
        // deleted.
        seeds_right_now = seeds.size();
    }

    // Proceed with dnsseeds if seednodes hasn't reached the target or if forcednsseed is set
    if (outbound_connection_count < SEED_OUTBOUND_CONNECTION_THRESHOLD || seeds_right_now) {
        // goal: only query DNS seed if address need is acute
        // * If we have a reasonable number of peers in addrman, spend
        //   some time trying them first. This improves user privacy by
        //   creating fewer identifying DNS requests, reduces trust by
        //   giving seeds less influence on the network topology, and
        //   reduces traffic to the seeds.
        // * When querying DNS seeds query a few at once, this ensures
        //   that we don't give DNS seeds the ability to eclipse nodes
        //   that query them.
        // * If we continue having problems, eventually query all the
        //   DNS seeds, and if that fails too, also try the fixed seeds.
        //   (done in ThreadOpenConnections)
        int found = 0;
        const std::chrono::seconds seeds_wait_time = (addrman.Size() >= DNSSEEDS_DELAY_PEER_THRESHOLD ? DNSSEEDS_DELAY_MANY_PEERS : DNSSEEDS_DELAY_FEW_PEERS);

        for (const std::string& seed : seeds) {
            if (seeds_right_now == 0) {
                seeds_right_now += DNSSEEDS_TO_QUERY_AT_ONCE;

                if (addrman.Size() > 0) {
                    LogPrintf("Waiting %d seconds before querying DNS seeds.\n", seeds_wait_time.count());
                    std::chrono::seconds to_wait = seeds_wait_time;
                    while (to_wait.count() > 0) {
                        // if sleeping for the MANY_PEERS interval, wake up
                        // early to see if we have enough peers and can stop
                        // this thread entirely freeing up its resources
                        std::chrono::seconds w = std::min(DNSSEEDS_DELAY_FEW_PEERS, to_wait);
                        if (!interruptNet.sleep_for(w)) return;
                        to_wait -= w;

                        if (GetFullOutboundConnCount() >= SEED_OUTBOUND_CONNECTION_THRESHOLD) {
                            if (found > 0) {
                                LogPrintf("%d addresses found from DNS seeds\n", found);
                                LogPrintf("P2P peers available. Finished DNS seeding.\n");
                            } else {
                                LogPrintf("P2P peers available. Skipped DNS seeding.\n");
                            }
                            return;
                        }
                    }
                }
            }

            if (interruptNet) return;

            // hold off on querying seeds if P2P network deactivated
            if (!fNetworkActive) {
                LogPrintf("Waiting for network to be reactivated before querying DNS seeds.\n");
                do {
                    if (!interruptNet.sleep_for(std::chrono::seconds{1})) return;
                } while (!fNetworkActive);
            }

            LogPrintf("Loading addresses from DNS seed %s\n", seed);
            // If -proxy is in use, we make an ADDR_FETCH connection to the DNS resolved peer address
            // for the base dns seed domain in chainparams
            if (HaveNameProxy()) {
                AddAddrFetch(seed);
            } else {
                std::vector<CAddress> vAdd;
                constexpr ServiceFlags requiredServiceBits{SeedsServiceFlags()};
                std::string host = strprintf("x%x.%s", requiredServiceBits, seed);
                CNetAddr resolveSource;
                if (!resolveSource.SetInternal(host)) {
                    continue;
                }
                // Limit number of IPs learned from a single DNS seed. This limit exists to prevent the results from
                // one DNS seed from dominating AddrMan. Note that the number of results from a UDP DNS query is
                // bounded to 33 already, but it is possible for it to use TCP where a larger number of results can be
                // returned.
                unsigned int nMaxIPs = 32;
                const auto addresses{LookupHost(host, nMaxIPs, true)};
                if (!addresses.empty()) {
                    for (const CNetAddr& ip : addresses) {
                        CAddress addr = CAddress(CService(ip, m_params.GetDefaultPort()), requiredServiceBits);
                        addr.nTime = rng.rand_uniform_delay(Now<NodeSeconds>() - 3 * 24h, -4 * 24h); // use a random age between 3 and 7 days old
                        vAdd.push_back(addr);
                        found++;
                    }
                    addrman.Add(vAdd, resolveSource);
                } else {
                    // If the seed does not support a subdomain with our desired service bits,
                    // we make an ADDR_FETCH connection to the DNS resolved peer address for the
                    // base dns seed domain in chainparams
                    AddAddrFetch(seed);
                }
            }
            --seeds_right_now;
        }
        LogPrintf("%d addresses found from DNS seeds\n", found);
    } else {
        LogPrintf("Skipping DNS seeds. Enough peers have been found\n");
    }
}